

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * __thiscall
lest::to_string<int,double>
          (string *__return_storage_ptr__,lest *this,int *lhs,string *op,double *rhs)

{
  ostream *poVar1;
  ostringstream os;
  char *local_1d8;
  size_type local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  double in_stack_fffffffffffffe40;
  string local_1b8 [32];
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  to_string_abi_cxx11_(0);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&local_1d8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  to_string_abi_cxx11_(in_stack_fffffffffffffe40);
  std::operator<<(poVar1,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1d8 == &local_1c8) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1c7,local_1c8);
    *(double *)((long)&__return_storage_ptr__->field_2 + 8) = in_stack_fffffffffffffe40;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1d8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1c7,local_1c8);
  }
  __return_storage_ptr__->_M_string_length = local_1d0;
  local_1d0 = 0;
  local_1c8 = '\0';
  local_1d8 = &local_1c8;
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}